

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O2

void __thiscall Constraint::Constraint(Constraint *this)

{
  Expression *this_00;
  
  this->lowerbound = -INFINITY;
  this->upperbound = INFINITY;
  this_00 = (Expression *)operator_new(0x58);
  Expression::Expression(this_00);
  std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Expression,void>
            ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)&this->expr,this_00);
  return;
}

Assistant:

Constraint() : expr(std::shared_ptr<Expression>(new Expression)){}